

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O0

QList<QKeyCombination> *
QXkbCommon::possibleKeyCombinations
          (xkb_state *state,QKeyEvent *event,bool superAsMeta,bool hyperAsMeta)

{
  KeyboardModifiers modifiers_00;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  quint32 qVar5;
  QFlags<Qt::KeyboardModifier> mask;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  Key sym_00;
  uint uVar11;
  QFlagsStorage<Qt::KeyboardModifier> lhs;
  Int IVar12;
  Key KVar13;
  Key KVar14;
  undefined8 uVar15;
  pointer pxVar16;
  const_iterator o;
  QKeyCombination *pQVar17;
  QKeyEvent *in_RDX;
  undefined8 in_RSI;
  xkb_state *in_RDI;
  long in_FS_OFFSET;
  add_const_t<QList<QKeyCombination>_> *__range3;
  bool ambiguous;
  uint i;
  int qtKey;
  xkb_mod_mask_t depressed;
  xkb_mod_index_t metaMod;
  xkb_mod_index_t controlMod;
  xkb_mod_index_t altMod;
  xkb_mod_index_t shiftMod;
  int baseQtKey;
  xkb_keysym_t sym;
  xkb_level_index_t levelIndex;
  xkb_layout_index_t layoutIndex;
  xkb_mod_mask_t depressedMods;
  xkb_mod_mask_t lockedMods;
  xkb_mod_mask_t latchedMods;
  xkb_layout_index_t lockedLayout;
  xkb_state *queryState;
  xkb_keymap *keymap;
  quint32 keycode;
  QList<QKeyCombination> *result;
  QKeyCombination keyCombination;
  const_iterator __end3;
  const_iterator __begin3;
  KeyboardModifiers mods;
  KeyboardModifiers neededMods;
  ScopedXKBState scopedXkbQueryState;
  KeyboardModifiers notNeeded;
  KeyboardModifiers modifiers;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_fffffffffffffe88;
  int combined;
  KeyboardModifier in_stack_fffffffffffffe8c;
  enum_type in_stack_fffffffffffffe90;
  enum_type in_stack_fffffffffffffe94;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined2 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea2;
  undefined1 in_stack_fffffffffffffea3;
  undefined4 in_stack_fffffffffffffea4;
  xkb_state *this;
  undefined1 in_stack_fffffffffffffeba;
  undefined1 in_stack_fffffffffffffebb;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_fffffffffffffebc;
  xkb_state *in_stack_fffffffffffffec0;
  xkb_keysym_t in_stack_fffffffffffffec8;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_fffffffffffffecc;
  uint uVar18;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  uint uVar19;
  xkb_keysym_t local_10c;
  uint local_108;
  QKeyCombination local_9c [2];
  KeyboardModifiers modifiers_01;
  const_iterator local_88;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_7c;
  QFlagsStorage<Qt::KeyboardModifier> local_78;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_74;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_70;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_6c;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_68;
  Int local_64;
  Int local_60;
  QFlagsStorage<Qt::KeyboardModifier> local_5c;
  int local_58;
  Int local_54;
  QDebug local_30;
  undefined1 *local_28;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_20;
  QFlagsStorage<Qt::KeyboardModifier> local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(QKeyCombination **)(in_RDI + 8) = (QKeyCombination *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)(in_RDI + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QList<QKeyCombination>::QList((QList<QKeyCombination> *)0xb3f4e4);
  qVar5 = QKeyEvent::nativeScanCode(in_RDX);
  if (qVar5 != 0) {
    local_1c.i = 0xaaaaaaaa;
    local_1c.i = (Int)QKeyEvent::modifiers
                                ((QKeyEvent *)
                                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    uVar15 = xkb_state_get_keymap(in_RSI);
    local_20.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)0xaaaaaaaa;
    local_20.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         Qt::operator|(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
    mask = QFlags<Qt::KeyboardModifier>::operator~
                     ((QFlags<Qt::KeyboardModifier> *)
                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    QFlags<Qt::KeyboardModifier>::operator&=((QFlags<Qt::KeyboardModifier> *)&local_1c,mask);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    xkb_state_new(uVar15);
    std::unique_ptr<xkb_state,QXkbCommon::XKBStateDeleter>::
    unique_ptr<QXkbCommon::XKBStateDeleter,void>
              ((unique_ptr<xkb_state,_QXkbCommon::XKBStateDeleter> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (pointer)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    pxVar16 = std::unique_ptr<xkb_state,_QXkbCommon::XKBStateDeleter>::get
                        ((unique_ptr<xkb_state,_QXkbCommon::XKBStateDeleter> *)0xb3f5d4);
    if (pxVar16 == (pointer)0x0) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcQpaKeyMapper();
      anon_unknown.dwarf_1fe24f5::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
        anon_unknown.dwarf_1fe24f5::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb3f63e);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)
                   CONCAT44(in_stack_fffffffffffffea4,
                            CONCAT13(in_stack_fffffffffffffea3,
                                     CONCAT12(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0)))
                   ,(char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98.i),
                   in_stack_fffffffffffffe94,
                   (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   (char *)0xb3f657);
        QMessageLogger::warning();
        QDebug::operator<<((QDebug *)this,
                           (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        QDebug::operator<<((QDebug *)this,
                           (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        QDebug::~QDebug(&local_30);
        local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
      }
    }
    else {
      iVar6 = xkb_state_serialize_layout(in_RSI,0x40);
      uVar7 = xkb_state_serialize_mods(in_RSI,2);
      uVar8 = xkb_state_serialize_mods(in_RSI,4);
      uVar9 = xkb_state_serialize_mods(in_RSI,1);
      combined = iVar6;
      xkb_state_update_mask(pxVar16,uVar9,uVar7,uVar8,0);
      iVar10 = xkb_state_key_get_layout(pxVar16,qVar5);
      local_108 = 0;
      if ((iVar10 != -1) &&
         (local_108 = xkb_state_key_get_level(pxVar16,qVar5,iVar10), local_108 == 0xffffffff)) {
        local_108 = 0;
      }
      if (local_108 < 2) {
        combined = iVar6;
        xkb_state_update_mask(pxVar16,0,uVar7,uVar8,0);
      }
      iVar10 = xkb_state_key_get_one_sym(pxVar16,qVar5);
      pQVar17 = stack0xffffffffffffff68;
      if (iVar10 != 0) {
        local_54 = local_1c.i;
        modifiers_01.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
        super_QFlagsStorage<Qt::KeyboardModifier>.i =
             SUB84((ulong)stack0xffffffffffffff68 >> 0x20,0);
        sym_00 = keysymToQtKey_internal
                           (in_stack_fffffffffffffec8,modifiers_01,in_stack_fffffffffffffec0,
                            in_stack_fffffffffffffebc.i,(bool)in_stack_fffffffffffffebb,
                            (bool)in_stack_fffffffffffffeba);
        stack0xffffffffffffff68 = pQVar17;
        if (sym_00 != 0) {
          ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
          local_58 = (int)QKeyCombination::fromCombined(combined);
          QList<QKeyCombination>::operator+=
                    ((QList<QKeyCombination> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     (rvalue_ref)CONCAT44(in_stack_fffffffffffffe8c,combined));
        }
        bVar2 = xkb_keymap_mod_get_index(uVar15,"Shift");
        bVar3 = xkb_keymap_mod_get_index(uVar15,"Alt");
        bVar4 = xkb_keymap_mod_get_index(uVar15,"Control");
        uVar11 = xkb_keymap_mod_get_index(uVar15,"Meta");
        for (uVar18 = 1; uVar18 < 9; uVar18 = uVar18 + 1) {
          local_60 = ModsTbl[uVar18].super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                     super_QFlagsStorage<Qt::KeyboardModifier>.i;
          local_5c.i = local_60;
          lhs.i = (Int)QFlags<Qt::KeyboardModifier>::operator&
                                 ((QFlags<Qt::KeyboardModifier> *)
                                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                  in_stack_fffffffffffffe98.i);
          local_64 = local_5c.i;
          bVar1 = ::operator==((QFlags<Qt::KeyboardModifier>)lhs.i,
                               (QFlags<Qt::KeyboardModifier>)local_5c.i);
          if (bVar1) {
            if (uVar18 == 8) {
              bVar1 = isLatin1(sym_00);
              if (bVar1) goto LAB_00b3fd5c;
              local_10c = lookupLatinKeysym((xkb_state *)CONCAT44(uVar18,lhs.i),
                                            in_stack_fffffffffffffecc.i);
            }
            else {
              uVar19 = 0;
              local_68.super_QFlagsStorage<Qt::KeyboardModifier>.i =
                   (QFlagsStorage<Qt::KeyboardModifier>)
                   QFlags<Qt::KeyboardModifier>::operator&
                             ((QFlags<Qt::KeyboardModifier> *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              in_stack_fffffffffffffe8c);
              IVar12 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_68);
              if (IVar12 != 0) {
                uVar19 = 1 << (bVar3 & 0x1f) | uVar19;
              }
              local_6c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
                   (QFlagsStorage<Qt::KeyboardModifier>)
                   QFlags<Qt::KeyboardModifier>::operator&
                             ((QFlags<Qt::KeyboardModifier> *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              in_stack_fffffffffffffe8c);
              IVar12 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_6c);
              if (IVar12 != 0) {
                uVar19 = 1 << (bVar2 & 0x1f) | uVar19;
              }
              local_70.super_QFlagsStorage<Qt::KeyboardModifier>.i =
                   (QFlagsStorage<Qt::KeyboardModifier>)
                   QFlags<Qt::KeyboardModifier>::operator&
                             ((QFlags<Qt::KeyboardModifier> *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              in_stack_fffffffffffffe8c);
              IVar12 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_70);
              if (IVar12 != 0) {
                uVar19 = 1 << (bVar4 & 0x1f) | uVar19;
              }
              bVar1 = false;
              if (uVar11 < 0x20) {
                local_74.super_QFlagsStorage<Qt::KeyboardModifier>.i =
                     (QFlagsStorage<Qt::KeyboardModifier>)
                     QFlags<Qt::KeyboardModifier>::operator&
                               ((QFlags<Qt::KeyboardModifier> *)
                                CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                in_stack_fffffffffffffe8c);
                IVar12 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_74);
                bVar1 = IVar12 != 0;
              }
              if (bVar1) {
                uVar19 = 1 << ((byte)uVar11 & 0x1f) | uVar19;
              }
              combined = iVar6;
              xkb_state_update_mask(pxVar16,uVar19,uVar7,uVar8,0);
              local_10c = xkb_state_key_get_one_sym(pxVar16,qVar5);
            }
            if (local_10c != 0) {
              local_78.i = 0xaaaaaaaa;
              in_stack_fffffffffffffecc.i =
                   (Int)QFlags<Qt::KeyboardModifier>::operator~
                                  ((QFlags<Qt::KeyboardModifier> *)
                                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
              local_7c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
                   (QFlagsStorage<Qt::KeyboardModifier>)
                   QFlags<Qt::KeyboardModifier>::operator&
                             ((QFlags<Qt::KeyboardModifier> *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              (QFlags<Qt::KeyboardModifier>)in_stack_fffffffffffffe98.i);
              pQVar17 = stack0xffffffffffffff68;
              modifiers_01.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
              super_QFlagsStorage<Qt::KeyboardModifier>.i =
                   SUB84((ulong)stack0xffffffffffffff68 >> 0x20,0);
              modifiers_00.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
              super_QFlagsStorage<Qt::KeyboardModifier>.i =
                   modifiers_01.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                   super_QFlagsStorage<Qt::KeyboardModifier>.i;
              unique0x10000976 = pQVar17;
              local_78.i = (Int)local_7c.super_QFlagsStorage<Qt::KeyboardModifier>.i;
              KVar13 = keysymToQtKey_internal
                                 (in_stack_fffffffffffffec8,modifiers_00,in_stack_fffffffffffffec0,
                                  in_stack_fffffffffffffebc.i,(bool)in_stack_fffffffffffffebb,
                                  (bool)in_stack_fffffffffffffeba);
              if ((KVar13 != 0) && (KVar13 != sym_00)) {
                in_stack_fffffffffffffec8 = in_stack_fffffffffffffec8 & 0xffffff;
                local_88.i = (QKeyCombination *)&DAT_aaaaaaaaaaaaaaaa;
                in_stack_fffffffffffffec0 = this;
                local_88 = QList<QKeyCombination>::begin
                                     ((QList<QKeyCombination> *)
                                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))
                ;
                o = QList<QKeyCombination>::end
                              ((QList<QKeyCombination> *)
                               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
                while (unique0x1000097e = o,
                      bVar1 = QList<QKeyCombination>::const_iterator::operator!=(&local_88,o), bVar1
                      ) {
                  local_9c[0].combination = -0x55555556;
                  pQVar17 = QList<QKeyCombination>::const_iterator::operator*(&local_88);
                  local_9c[0].combination = pQVar17->combination;
                  KVar14 = QKeyCombination::key(local_9c);
                  bVar1 = false;
                  if (KVar14 == KVar13) {
                    QKeyCombination::keyboardModifiers
                              ((QKeyCombination *)
                               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
                    in_stack_fffffffffffffebc.i =
                         (Int)QFlags<Qt::KeyboardModifier>::operator&
                                        ((QFlags<Qt::KeyboardModifier> *)
                                         CONCAT44(in_stack_fffffffffffffe94,
                                                  in_stack_fffffffffffffe90),
                                         in_stack_fffffffffffffe98.i);
                    bVar1 = ::operator==((QFlags<Qt::KeyboardModifier>)in_stack_fffffffffffffebc.i,
                                         (QFlags<Qt::KeyboardModifier>)local_78.i);
                  }
                  if (bVar1 != false) {
                    in_stack_fffffffffffffec8 = CONCAT13(1,(int3)in_stack_fffffffffffffec8);
                    break;
                  }
                  QList<QKeyCombination>::const_iterator::operator++(&local_88);
                }
                if ((in_stack_fffffffffffffec8 & 0x1000000) == 0) {
                  ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_78);
                  QKeyCombination::fromCombined(combined);
                  QList<QKeyCombination>::operator+=
                            ((QList<QKeyCombination> *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             (rvalue_ref)CONCAT44(in_stack_fffffffffffffe8c,combined));
                }
              }
            }
          }
LAB_00b3fd5c:
        }
      }
    }
    std::unique_ptr<xkb_state,_QXkbCommon::XKBStateDeleter>::~unique_ptr
              ((unique_ptr<xkb_state,_QXkbCommon::XKBStateDeleter> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QKeyCombination> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QKeyCombination> QXkbCommon::possibleKeyCombinations(xkb_state *state, const QKeyEvent *event,
                                    bool superAsMeta, bool hyperAsMeta)
{
    QList<QKeyCombination> result;
    quint32 keycode = event->nativeScanCode();
    if (!keycode)
        return result;

    Qt::KeyboardModifiers modifiers = event->modifiers();
    xkb_keymap *keymap = xkb_state_get_keymap(state);
    // turn off the modifier bits which doesn't participate in shortcuts
    Qt::KeyboardModifiers notNeeded = Qt::KeypadModifier | Qt::GroupSwitchModifier;
    modifiers &= ~notNeeded;
    // create a fresh kb state and test against the relevant modifier combinations
    ScopedXKBState scopedXkbQueryState(xkb_state_new(keymap));
    xkb_state *queryState = scopedXkbQueryState.get();
    if (!queryState) {
        qCWarning(lcQpaKeyMapper) << Q_FUNC_INFO << "failed to compile xkb keymap";
        return result;
    }
    // get kb state from the master state and update the temporary state
    xkb_layout_index_t lockedLayout = xkb_state_serialize_layout(state, XKB_STATE_LAYOUT_LOCKED);
    xkb_mod_mask_t latchedMods = xkb_state_serialize_mods(state, XKB_STATE_MODS_LATCHED);
    xkb_mod_mask_t lockedMods = xkb_state_serialize_mods(state, XKB_STATE_MODS_LOCKED);
    xkb_mod_mask_t depressedMods = xkb_state_serialize_mods(state, XKB_STATE_MODS_DEPRESSED);
    xkb_state_update_mask(queryState, depressedMods, latchedMods, lockedMods, 0, 0, lockedLayout);
    // handle shortcuts for level three and above
    xkb_layout_index_t layoutIndex = xkb_state_key_get_layout(queryState, keycode);
    xkb_level_index_t levelIndex = 0;
    if (layoutIndex != XKB_LAYOUT_INVALID) {
        levelIndex = xkb_state_key_get_level(queryState, keycode, layoutIndex);
        if (levelIndex == XKB_LEVEL_INVALID)
            levelIndex = 0;
    }
    if (levelIndex <= 1)
        xkb_state_update_mask(queryState, 0, latchedMods, lockedMods, 0, 0, lockedLayout);

    xkb_keysym_t sym = xkb_state_key_get_one_sym(queryState, keycode);
    if (sym == XKB_KEY_NoSymbol)
        return result;

    int baseQtKey = keysymToQtKey_internal(sym, modifiers, queryState, keycode, superAsMeta, hyperAsMeta);
    if (baseQtKey)
        result += QKeyCombination::fromCombined(baseQtKey + int(modifiers));

    xkb_mod_index_t shiftMod = xkb_keymap_mod_get_index(keymap, "Shift");
    xkb_mod_index_t altMod = xkb_keymap_mod_get_index(keymap, "Alt");
    xkb_mod_index_t controlMod = xkb_keymap_mod_get_index(keymap, "Control");
    xkb_mod_index_t metaMod = xkb_keymap_mod_get_index(keymap, "Meta");

    Q_ASSERT(shiftMod < 32);
    Q_ASSERT(altMod < 32);
    Q_ASSERT(controlMod < 32);

    xkb_mod_mask_t depressed;
    int qtKey = 0;
    // obtain a list of possible shortcuts for the given key event
    for (uint i = 1; i < sizeof(ModsTbl) / sizeof(*ModsTbl) ; ++i) {
        Qt::KeyboardModifiers neededMods = ModsTbl[i];
        if ((modifiers & neededMods) == neededMods) {
            if (i == 8) {
                if (isLatin1(baseQtKey))
                    continue;
                // add a latin key as a fall back key
                sym = lookupLatinKeysym(state, keycode);
            } else {
                depressed = 0;
                if (neededMods & Qt::AltModifier)
                    depressed |= (1 << altMod);
                if (neededMods & Qt::ShiftModifier)
                    depressed |= (1 << shiftMod);
                if (neededMods & Qt::ControlModifier)
                    depressed |= (1 << controlMod);
                if (metaMod < 32 && neededMods & Qt::MetaModifier)
                    depressed |= (1 << metaMod);
                xkb_state_update_mask(queryState, depressed, latchedMods, lockedMods, 0, 0, lockedLayout);
                sym = xkb_state_key_get_one_sym(queryState, keycode);
            }
            if (sym == XKB_KEY_NoSymbol)
                continue;

            Qt::KeyboardModifiers mods = modifiers & ~neededMods;
            qtKey = keysymToQtKey_internal(sym, mods, queryState, keycode, superAsMeta, hyperAsMeta);
            if (!qtKey || qtKey == baseQtKey)
                continue;

            // catch only more specific shortcuts, i.e. Ctrl+Shift+= also generates Ctrl++ and +,
            // but Ctrl++ is more specific than +, so we should skip the last one
            bool ambiguous = false;
            for (auto keyCombination : std::as_const(result)) {
                if (keyCombination.key() == qtKey
                    && (keyCombination.keyboardModifiers() & mods) == mods) {
                    ambiguous = true;
                    break;
                }
            }
            if (ambiguous)
                continue;

            result += QKeyCombination::fromCombined(qtKey + int(mods));
        }
    }

    return result;
}